

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnData::UpdateInternal
          (ColumnData *this,TransactionData transaction,idx_t column_index,Vector *update_vector,
          row_t *row_ids,idx_t update_count,Vector *base_vector)

{
  _Head_base<0UL,_duckdb::UpdateSegment_*,_false> __p;
  pointer this_00;
  _Head_base<0UL,_duckdb::UpdateSegment_*,_false> local_38;
  
  ::std::mutex::lock(&this->update_lock);
  if ((this->updates).
      super_unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t.
      super___uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>._M_t
      .super__Tuple_impl<0UL,_duckdb::UpdateSegment_*,_std::default_delete<duckdb::UpdateSegment>_>.
      super__Head_base<0UL,_duckdb::UpdateSegment_*,_false>._M_head_impl == (UpdateSegment *)0x0) {
    make_uniq<duckdb::UpdateSegment,duckdb::ColumnData&>((duckdb *)&local_38,this);
    __p._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>::
    reset((__uniq_ptr_impl<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_> *)
          &this->updates,__p._M_head_impl);
    ::std::unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_>::
    ~unique_ptr((unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>_> *)
                &local_38);
  }
  this_00 = unique_ptr<duckdb::UpdateSegment,_std::default_delete<duckdb::UpdateSegment>,_true>::
            operator->(&this->updates);
  UpdateSegment::Update
            (this_00,transaction,column_index,update_vector,row_ids,update_count,base_vector);
  pthread_mutex_unlock((pthread_mutex_t *)&this->update_lock);
  return;
}

Assistant:

void ColumnData::UpdateInternal(TransactionData transaction, idx_t column_index, Vector &update_vector, row_t *row_ids,
                                idx_t update_count, Vector &base_vector) {
	lock_guard<mutex> update_guard(update_lock);
	if (!updates) {
		updates = make_uniq<UpdateSegment>(*this);
	}
	updates->Update(transaction, column_index, update_vector, row_ids, update_count, base_vector);
}